

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

RepeatedField<float> *
google::protobuf::Arena::InternalHelper<google::protobuf::RepeatedField<float>>::
Construct<google::protobuf::Arena*>(void *ptr,Arena **args)

{
  Arena **args_local;
  void *ptr_local;
  
  RepeatedField<float>::RepeatedField((RepeatedField<float> *)ptr,*args);
  return (RepeatedField<float> *)ptr;
}

Assistant:

static T* PROTOBUF_NONNULL Construct(void* PROTOBUF_NONNULL ptr,
                                         Args&&... args) {
      return new (ptr) T(static_cast<Args&&>(args)...);
    }